

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.cpp
# Opt level: O0

Color * __thiscall Plane::getTextureColor(Color *__return_storage_ptr__,Plane *this,Vector3 *p)

{
  bool bVar1;
  double dVar2;
  Vector3 local_58;
  double local_40;
  double v;
  double local_20;
  double u;
  Vector3 *p_local;
  Plane *this_local;
  
  u = (double)p;
  p_local = (Vector3 *)this;
  bVar1 = Material::hasTexture((this->super_Object).m_material);
  if (bVar1) {
    operator-((Vector3 *)&v,(Vector3 *)u,&this->m_o);
    dVar2 = Vector3::dot((Vector3 *)&v,&this->m_dx);
    local_20 = Vector3::mod2(&this->m_dx);
    local_20 = dVar2 / local_20;
    operator-(&local_58,(Vector3 *)u,&this->m_o);
    dVar2 = Vector3::dot(&local_58,&this->m_dy);
    local_40 = Vector3::mod2(&this->m_dy);
    local_40 = dVar2 / local_40;
    dVar2 = floor(local_20);
    local_20 = local_20 - dVar2;
    dVar2 = floor(local_40);
    local_40 = local_40 - dVar2;
    Material::getTextureColor
              (__return_storage_ptr__,(this->super_Object).m_material,local_20,local_40);
  }
  else {
    Color::Color(__return_storage_ptr__,1.0,1.0,1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Plane::getTextureColor(const Vector3& p) const
{
    if (m_material->hasTexture())
    {
        double u = (p - m_o).dot(m_dx) / m_dx.mod2(),
               v = (p - m_o).dot(m_dy) / m_dy.mod2();
        u -= floor(u), v -= floor(v);
        return m_material->getTextureColor(u, v);
    }
    else
        return Color(1, 1, 1);
}